

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,FuncDecl *node)

{
  BuilderContext *pBVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  FunctionModule *pFVar5;
  size_type sVar6;
  __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar7;
  element_type *peVar8;
  element_type *node_00;
  pointer pBVar9;
  _List_iterator<mocker::ir::BasicBlock> local_308;
  undefined4 local_2fc;
  _List_iterator<mocker::ir::BasicBlock> local_2f8;
  __shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_2f0;
  shared_ptr<mocker::ast::Statement> *p;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  *__range2_1;
  shared_ptr<mocker::ir::Reg> local_2b0;
  shared_ptr<mocker::ir::Alloca> local_2a0;
  shared_ptr<mocker::ir::IRInst> local_290;
  BBLIter local_280;
  string local_278 [32];
  undefined1 local_258 [8];
  shared_ptr<mocker::ir::Reg> reg_1;
  string name;
  size_t i;
  string local_218 [32];
  shared_ptr<mocker::ir::Reg> local_1f8;
  shared_ptr<mocker::ir::Alloca> local_1e8;
  shared_ptr<mocker::ir::IRInst> local_1d8;
  BBLIter local_1c8;
  allocator<char> local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  shared_ptr<mocker::ir::Reg> reg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  string local_168;
  FunctionModule local_148;
  FunctionModule *local_70;
  FunctionModule *func;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  *__range2;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramIdent;
  bool isMember;
  FuncDecl *node_local;
  Builder *this_local;
  
  peVar3 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  pcVar4 = (char *)std::__cxx11::string::at((ulong)&peVar3->val);
  paramIdent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = *pcVar4 == '#';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  if ((paramIdent.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
               (char (*) [5])"this");
  }
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ::begin(&node->formalParameters);
  param = (shared_ptr<mocker::ast::VarDeclStmt> *)
          std::
          vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
          ::end(&node->formalParameters);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
                                     *)&param), bVar2) {
    func = (FunctionModule *)
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
           ::operator*(&__end2);
    peVar7 = std::
             __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)func);
    peVar3 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar7->identifier);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
               &peVar3->val);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
    ::operator++(&__end2);
  }
  pBVar1 = this->ctx;
  peVar3 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  std::__cxx11::string::string((string *)&local_168,(string *)&peVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_180,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  FunctionModule::FunctionModule(&local_148,&local_168,&local_180,false);
  pFVar5 = BuilderContext::addFunc(pBVar1,&local_148);
  FunctionModule::~FunctionModule(&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180);
  std::__cxx11::string::~string((string *)&local_168);
  pBVar1 = this->ctx;
  local_70 = pFVar5;
  sVar6 = std::
          vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
          ::size(&node->formalParameters);
  BuilderContext::initFuncCtx(pBVar1,sVar6);
  pBVar1 = this->ctx;
  reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)FunctionModule::pushBackBB(local_70);
  BuilderContext::setCurBasicBlock
            (pBVar1,(BBLIter)reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
  if ((paramIdent.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1b8,"this",&local_1b9);
    makeReg((Builder *)local_198,(string *)this);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    pBVar1 = this->ctx;
    local_1c8 = FunctionModule::getFirstBB(local_70);
    std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
              ((shared_ptr<mocker::ir::Reg> *)&local_1e8);
    std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>(&local_1d8,&local_1e8);
    BuilderContext::appendInstFront(pBVar1,local_1c8,&local_1d8);
    std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_1d8);
    std::shared_ptr<mocker::ir::Alloca>::~shared_ptr(&local_1e8);
    pBVar1 = this->ctx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_218,"0",(allocator<char> *)((long)&i + 7));
    makeReg((Builder *)&local_1f8,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
              (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_198,&local_1f8);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_1f8);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_198);
  }
  for (name.field_2._8_8_ = 0;
      sVar6 = std::
              vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ::size(&node->formalParameters), (ulong)name.field_2._8_8_ < sVar6;
      name.field_2._8_8_ = name.field_2._8_8_ + 1) {
    this_00 = (__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                 ::operator[](&node->formalParameters,name.field_2._8_8_);
    peVar7 = std::
             __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    peVar3 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar7->identifier);
    std::__cxx11::string::string
              ((string *)
               &reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)&peVar3->val);
    std::__cxx11::string::string
              (local_278,
               (string *)
               &reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    makeReg((Builder *)local_258,(string *)this);
    std::__cxx11::string::~string(local_278);
    pBVar1 = this->ctx;
    local_280 = FunctionModule::getFirstBB(local_70);
    std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
              ((shared_ptr<mocker::ir::Reg> *)&local_2a0);
    std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>(&local_290,&local_2a0);
    BuilderContext::appendInstFront(pBVar1,local_280,&local_290);
    std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_290);
    std::shared_ptr<mocker::ir::Alloca>::~shared_ptr(&local_2a0);
    pBVar1 = this->ctx;
    std::__cxx11::to_string
              ((string *)&__range2_1,
               name.field_2._8_8_ +
               (ulong)(paramIdent.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    makeReg((Builder *)&local_2b0,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
              (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_258,&local_2b0);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_2b0);
    std::__cxx11::string::~string((string *)&__range2_1);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_258);
    std::__cxx11::string::~string
              ((string *)
               &reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  peVar8 = std::
           __shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&node->body);
  __end2_1 = std::
             vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
             ::begin(&peVar8->stmts);
  p = (shared_ptr<mocker::ast::Statement> *)
      std::
      vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
      ::end(&peVar8->stmts);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
                        *)&p);
    if (!bVar2) {
      local_308._M_node = (_List_node_base *)BuilderContext::getCurBasicBlock(this->ctx);
      pBVar9 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&local_308);
      bVar2 = BasicBlock::isCompleted(pBVar9);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        BuilderContext::emplaceInst<mocker::ir::Ret>(this->ctx);
      }
      local_2fc = 0;
LAB_001a9a00:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
      return;
    }
    local_2f0 = (__shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
                   ::operator*(&__end2_1);
    local_2f8._M_node = (_List_node_base *)BuilderContext::getCurBasicBlock(this->ctx);
    pBVar9 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&local_2f8);
    bVar2 = BasicBlock::isCompleted(pBVar9);
    if (bVar2) {
      local_2fc = 1;
      goto LAB_001a9a00;
    }
    node_00 = std::
              __shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*(local_2f0);
    visit<mocker::ast::Statement>(this,node_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void Builder::operator()(const ast::FuncDecl &node) const {
  bool isMember = node.identifier->val.at(0) == '#';
  std::vector<std::string> paramIdent;
  if (isMember)
    paramIdent.emplace_back("this");
  for (auto &param : node.formalParameters)
    paramIdent.emplace_back(param->identifier->val);

  auto &func =
      ctx.addFunc(FunctionModule(node.identifier->val, std::move(paramIdent)));
  ctx.initFuncCtx(node.formalParameters.size());
  ctx.setCurBasicBlock(func.pushBackBB());

  if (isMember) {
    auto reg = makeReg("this");
    ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(reg));
    ctx.emplaceInst<Store>(reg, makeReg("0"));
  }
  for (std::size_t i = 0; i < node.formalParameters.size(); ++i) {
    auto name = node.formalParameters[i]->identifier->val;
    auto reg = makeReg(name);
    ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(reg));
    ctx.emplaceInst<Store>(reg, makeReg(std::to_string(i + isMember)));
  }

  for (auto &p : node.body->stmts) {
    if (ctx.getCurBasicBlock()->isCompleted())
      return;
    visit(*p);
  }
  if (!ctx.getCurBasicBlock()->isCompleted())
    ctx.emplaceInst<Ret>();
}